

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O2

void __thiscall
barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::barcode_output_t
          (barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          flagser_parameters *params)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined1 auVar5 [16];
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)&params->output_name);
  file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::file_output_t
            (&this->
              super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>,
             &sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>).
  super_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>._vptr_output_t =
       (_func_int **)&PTR__barcode_output_t_0015dc28;
  this->current_dimension = 0;
  uVar1 = params->max_dimension;
  uVar2 = params->min_dimension;
  uVar3 = params->modulus;
  uVar4 = *(undefined2 *)&params->field_0x6;
  auVar5._6_2_ = uVar4;
  auVar5._4_2_ = uVar3;
  auVar5._2_2_ = uVar2;
  auVar5._0_2_ = uVar1;
  auVar5._8_8_ = 0;
  auVar5 = pshuflw(auVar5,auVar5,0xe1);
  this->min_dimension = (short)auVar5._0_4_;
  this->max_dimension = (short)((uint)auVar5._0_4_ >> 0x10);
  this->modulus = params->modulus;
  (this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->euler_characteristic = 0;
  return;
}

Assistant:

barcode_output_t(const flagser_parameters& params)
	    : file_output_t<Complex>(params.output_name), min_dimension(params.min_dimension),
	      max_dimension(params.max_dimension), modulus(params.modulus) {}